

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_stream_test.c
# Opt level: O0

void test_tcp_listen_accept_cancel(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_aio *aio;
  char *addr;
  nng_stream_listener *l;
  
  nng_log_set_logger(nng_stderr_logger);
  nuts_scratch_addr("tcp",0x40,test_tcp_listen_accept_cancel::nuts_addr_);
  aio = (nng_aio *)test_tcp_listen_accept_cancel::nuts_addr_;
  nVar1 = nng_aio_alloc((nng_aio **)&result__1,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x8f,"%s: expected success, got %s (%d)","nng_aio_alloc(&aio, NULL, NULL)"
                         ,pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_stream_listener_alloc((nng_stream_listener **)&addr,(char *)aio);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x92,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_alloc(&l, addr)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_stream_listener_listen((nng_stream_listener *)addr);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x93,"%s: expected success, got %s (%d)","nng_stream_listener_listen(l)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_stream_listener_accept((nng_stream_listener *)addr,_result__1);
  nng_msleep(100);
  nng_aio_free(_result__1);
  nng_stream_listener_close((nng_stream_listener *)addr);
  nng_stream_listener_free((nng_stream_listener *)addr);
  return;
}

Assistant:

void
test_tcp_listen_accept_cancel(void)
{
	nng_stream_listener *l;
	char                *addr;
	nng_aio             *aio;

	nng_log_set_logger(nng_stderr_logger);
	NUTS_ADDR(addr, "tcp");
	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));

	// start a listening stream listener but do not call accept
	NUTS_PASS(nng_stream_listener_alloc(&l, addr));
	NUTS_PASS(nng_stream_listener_listen(l));
	nng_stream_listener_accept(l, aio);
	nng_msleep(100);
	nng_aio_free(aio);
	nng_stream_listener_close(l);
	nng_stream_listener_free(l);
}